

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_utils.c
# Opt level: O0

char * get_filename_no_ext(char *src,char path_separator)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *lastsep;
  char *lastdot;
  char *retstr;
  char *opstr;
  char path_separator_local;
  char *src_local;
  
  if (src == (char *)0x0) {
    src_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(src);
    src_local = (char *)malloc(sVar1 + 1);
    if (src_local == (char *)0x0) {
      src_local = (char *)0x0;
    }
    else {
      strcpy(src_local,src);
      pcVar2 = strrchr(src_local,0x2e);
      pcVar3 = strrchr(src_local,(int)path_separator);
      if ((pcVar2 != (char *)0x0) && (pcVar3 != (char *)0x0)) {
        if (pcVar3 < pcVar2) {
          lastdot = (char *)malloc((long)pcVar2 - (long)pcVar3);
          if (lastdot == (char *)0x0) {
            free(src_local);
            return (char *)0x0;
          }
          strncpy(lastdot,pcVar3 + 1,(size_t)(pcVar2 + (-1 - (long)pcVar3)));
          lastdot[(long)(pcVar2 + (-1 - (long)pcVar3))] = '\0';
          free(src_local);
        }
        else {
          sVar1 = strlen(src_local);
          lastdot = (char *)malloc((size_t)(src_local + (sVar1 - (long)pcVar3)));
          if (lastdot == (char *)0x0) {
            free(src_local);
            return (char *)0x0;
          }
          sVar1 = strlen(src_local);
          strncpy(lastdot,pcVar3 + 1,(size_t)(src_local + (sVar1 - (long)pcVar3)));
          free(src_local);
        }
      }
      if ((pcVar2 != (char *)0x0) && (pcVar3 == (char *)0x0)) {
        lastdot = (char *)malloc((size_t)(pcVar2 + (1 - (long)src_local)));
        if (lastdot == (char *)0x0) {
          free(src_local);
          return (char *)0x0;
        }
        strncpy(lastdot,src_local,(long)pcVar2 - (long)src_local);
        lastdot[(long)pcVar2 - (long)src_local] = '\0';
        free(src_local);
      }
      if ((pcVar2 == (char *)0x0) && (pcVar3 != (char *)0x0)) {
        sVar1 = strlen(src_local);
        lastdot = (char *)malloc((size_t)(src_local + (sVar1 - (long)pcVar3)));
        if (lastdot == (char *)0x0) {
          free(src_local);
          return (char *)0x0;
        }
        sVar1 = strlen(src_local);
        strncpy(lastdot,pcVar3 + 1,(size_t)(src_local + (sVar1 - (long)pcVar3)));
        free(src_local);
      }
      if ((pcVar2 != (char *)0x0) || (pcVar3 != (char *)0x0)) {
        src_local = lastdot;
      }
    }
  }
  return src_local;
}

Assistant:

char *get_filename_no_ext(char *src, char path_separator) {
    char *opstr, *retstr;
    char *lastdot;
    char *lastsep;

    if (src == NULL)
         return NULL;

    if ((opstr = malloc(strlen(src) + 1)) == NULL)
        return NULL;

    strcpy(opstr, src);

    lastdot = strrchr(opstr, '.');
    lastsep = strrchr(opstr, path_separator);

    if (lastdot && lastsep) {
        // printf("\n lastdot = %li; lastsep = %li; lastdot-lastsep = %li \n", lastdot - opstr, lastsep - opstr, lastdot - lastsep);
        if (lastsep < lastdot) {
            if ((retstr = malloc(lastdot - lastsep)) == NULL) {
                free(opstr);
                return NULL;
            }
            strncpy(retstr, lastsep + 1, lastdot - lastsep - 1);
            retstr[lastdot - lastsep - 1] = '\0';
            free(opstr);
        } else {
            if ((retstr = malloc(opstr + strlen(opstr) - lastsep)) == NULL) {
                free(opstr);
                return NULL;
            }

            strncpy(retstr, lastsep + 1, opstr + strlen(opstr) - lastsep);
            free(opstr);
        }
    }

    if (lastdot && !lastsep) {
        if ((retstr = malloc(lastdot - opstr + 1)) == NULL) {
            free(opstr);
            return NULL;
        }

        strncpy(retstr, opstr, lastdot - opstr);
        retstr[lastdot - opstr] = '\0';
        free(opstr);
    }

    if (!lastdot && lastsep) {
        if ((retstr = malloc(opstr + strlen(opstr) - lastsep)) == NULL) {
            free(opstr);
            return NULL;
        }

        strncpy(retstr, lastsep + 1, opstr + strlen(opstr) - lastsep);
        free(opstr);
    }

    if (!lastdot && !lastsep) {
        return opstr;
    }

    return retstr;
}